

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

int64_t duckdb::ExtractElement<duckdb::interval_t>(DatePartSpecifier type,interval_t element)

{
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t input_02;
  interval_t input_03;
  interval_t input_04;
  interval_t input_05;
  interval_t input_06;
  interval_t input_07;
  NotImplementedException *this;
  int64_t in_RDX;
  MicrosecondsOperator *in_RSI;
  undefined1 in_DIL;
  interval_t input_08;
  interval_t input_09;
  interval_t input_10;
  undefined8 in_stack_fffffffffffffe38;
  allocator *paVar1;
  interval_t in_stack_fffffffffffffe58;
  interval_t in_stack_fffffffffffffe68;
  int64_t local_8;
  
  switch(in_DIL) {
  case 0:
    input_07.micros = in_RDX;
    input_07._0_8_ = in_RSI;
    local_8 = DatePart::YearOperator::Operation<duckdb::interval_t,long>(input_07);
    break;
  case 1:
    input_06.micros = in_RDX;
    input_06._0_8_ = in_RSI;
    local_8 = DatePart::MonthOperator::Operation<duckdb::interval_t,long>(input_06);
    break;
  case 2:
    input_05.micros = in_RDX;
    input_05._0_8_ = in_RSI;
    local_8 = DatePart::DayOperator::Operation<duckdb::interval_t,long>(input_05);
    break;
  case 3:
    input_04.micros = in_RDX;
    input_04._0_8_ = in_RSI;
    local_8 = DatePart::DecadeOperator::Operation<duckdb::interval_t,long>(input_04);
    break;
  case 4:
    input_03.micros = in_RDX;
    input_03._0_8_ = in_RSI;
    local_8 = DatePart::CenturyOperator::Operation<duckdb::interval_t,long>(input_03);
    break;
  case 5:
    input_02.micros = in_RDX;
    input_02._0_8_ = in_RSI;
    local_8 = DatePart::MillenniumOperator::Operation<duckdb::interval_t,long>(input_02);
    break;
  case 6:
    input_08.micros = in_RDX;
    input_08._0_8_ = in_RDX;
    local_8 = DatePart::MicrosecondsOperator::Operation<duckdb::interval_t,long>(in_RSI,input_08);
    break;
  case 7:
    input_00.micros._0_1_ = in_DIL;
    input_00._0_8_ = in_stack_fffffffffffffe38;
    input_00.micros._1_7_ = 0;
    local_8 = DatePart::MillisecondsOperator::Operation<duckdb::interval_t,long>(input_00);
    break;
  case 8:
    input_01.micros._0_1_ = in_DIL;
    input_01._0_8_ = in_stack_fffffffffffffe38;
    input_01.micros._1_7_ = 0;
    local_8 = DatePart::SecondsOperator::Operation<duckdb::interval_t,long>(input_01);
    break;
  case 9:
    input_09.micros = in_RDX;
    input_09._0_8_ = in_RDX;
    local_8 = DatePart::MinutesOperator::Operation<duckdb::interval_t,long>
                        ((MinutesOperator *)in_RSI,input_09);
    break;
  case 10:
    input_10.micros = in_RDX;
    input_10._0_8_ = in_RDX;
    local_8 = DatePart::HoursOperator::Operation<duckdb::interval_t,long>
                        ((HoursOperator *)in_RSI,input_10);
    break;
  case 0xb:
    local_8 = DatePart::DayOfWeekOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0xc:
    local_8 = DatePart::ISODayOfWeekOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0xd:
    local_8 = DatePart::WeekOperator::Operation<duckdb::interval_t,long>(in_stack_fffffffffffffe68);
    break;
  case 0xe:
    local_8 = DatePart::ISOYearOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0xf:
    input.micros._0_1_ = in_DIL;
    input._0_8_ = in_stack_fffffffffffffe38;
    input.micros._1_7_ = 0;
    local_8 = DatePart::QuarterOperator::Operation<duckdb::interval_t,long>(input);
    break;
  case 0x10:
    local_8 = DatePart::DayOfYearOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0x11:
    local_8 = DatePart::YearWeekOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe58);
    break;
  case 0x12:
    local_8 = DatePart::EraOperator::Operation<duckdb::interval_t,long>(in_stack_fffffffffffffe68);
    break;
  case 0x13:
    local_8 = DatePart::TimezoneOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0x14:
    local_8 = DatePart::TimezoneHourOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  case 0x15:
    local_8 = DatePart::TimezoneMinuteOperator::Operation<duckdb::interval_t,long>
                        (in_stack_fffffffffffffe68);
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    paVar1 = (allocator *)&stack0xfffffffffffffe5f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe60,"Specifier type not implemented for DATEPART",
               paVar1);
    duckdb::NotImplementedException::NotImplementedException
              (this,(string *)&stack0xfffffffffffffe60);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  return local_8;
}

Assistant:

static int64_t ExtractElement(DatePartSpecifier type, T element) {
	switch (type) {
	case DatePartSpecifier::YEAR:
		return DatePart::YearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MONTH:
		return DatePart::MonthOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DAY:
		return DatePart::DayOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DECADE:
		return DatePart::DecadeOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::CENTURY:
		return DatePart::CenturyOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MILLENNIUM:
		return DatePart::MillenniumOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::QUARTER:
		return DatePart::QuarterOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DOW:
		return DatePart::DayOfWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ISODOW:
		return DatePart::ISODayOfWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::DOY:
		return DatePart::DayOfYearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::WEEK:
		return DatePart::WeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ISOYEAR:
		return DatePart::ISOYearOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::YEARWEEK:
		return DatePart::YearWeekOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MICROSECONDS:
		return DatePart::MicrosecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MILLISECONDS:
		return DatePart::MillisecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::SECOND:
		return DatePart::SecondsOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::MINUTE:
		return DatePart::MinutesOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::HOUR:
		return DatePart::HoursOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::ERA:
		return DatePart::EraOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE:
		return DatePart::TimezoneOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE_HOUR:
		return DatePart::TimezoneHourOperator::template Operation<T, int64_t>(element);
	case DatePartSpecifier::TIMEZONE_MINUTE:
		return DatePart::TimezoneMinuteOperator::template Operation<T, int64_t>(element);
	default:
		throw NotImplementedException("Specifier type not implemented for DATEPART");
	}
}